

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendar.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarRegistry::QCalendarRegistry(QCalendarRegistry *this)

{
  QFlatMap<QString,_QCalendarBackend_*,_QCalendarRegistryCaseInsensitiveAnyStringViewLessThan,_QList<QString>,_std::vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>_>
  *in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc8;
  QFlatMap<QString,_QCalendarBackend_*,_QCalendarRegistryCaseInsensitiveAnyStringViewLessThan,_QList<QString>,_std::vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>_>
  *pQVar1;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  QString **this_00;
  
  uVar2 = 0;
  pQVar1 = in_RDI;
  QReadWriteLock::QReadWriteLock
            ((QReadWriteLock *)in_RDI,(RecursionMode)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  this_00 = &(pQVar1->c).keys.d.ptr;
  std::vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>::vector
            ((vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_> *)0x564c1d);
  QFlatMap<QString,_QCalendarBackend_*,_QCalendarRegistryCaseInsensitiveAnyStringViewLessThan,_QList<QString>,_std::vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>_>
  ::QFlatMap((QFlatMap<QString,_QCalendarBackend_*,_QCalendarRegistryCaseInsensitiveAnyStringViewLessThan,_QList<QString>,_std::vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>_>
              *)0x564c30);
  QAtomicPointer<const_QCalendarBackend>::QAtomicPointer
            ((QAtomicPointer<const_QCalendarBackend> *)in_RDI,
             (QCalendarBackend *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  QAtomicInt::QAtomicInt((QAtomicInt *)in_RDI,in_stack_ffffffffffffffbc);
  std::vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>::resize
            ((vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_> *)this_00,
             CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  QFlatMap<QString,_QCalendarBackend_*,_QCalendarRegistryCaseInsensitiveAnyStringViewLessThan,_QList<QString>,_std::vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>_>
  ::reserve(in_RDI,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  return;
}

Assistant:

QCalendarRegistry()
    {
        byId.resize(ExpectedNumberOfBackends);
        byName.reserve(ExpectedNumberOfBackends * 2); // assume one alias on average
    }